

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O2

bool google::protobuf::compiler::cpp::UsingImplicitWeakDescriptor
               (FileDescriptor *file,Options *options)

{
  bool bVar1;
  
  bVar1 = HasDescriptorMethods(file,options);
  if (((bVar1) && (bVar1 = IsBootstrapProto(options,file), !bVar1)) &&
     (options->descriptor_implicit_weak_messages == true)) {
    return (bool)(options->opensource_runtime ^ 1);
  }
  return false;
}

Assistant:

bool UsingImplicitWeakDescriptor(const FileDescriptor* file,
                                 const Options& options) {
  return HasDescriptorMethods(file, options) &&
         !IsBootstrapProto(options, file) &&
         options.descriptor_implicit_weak_messages &&
         !options.opensource_runtime;
}